

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QStringList * __thiscall
QCommandLineParser::values(QCommandLineParser *this,QCommandLineOption *option)

{
  long lVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffffe0;
  QCommandLineParser *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCommandLineOption::names((QCommandLineOption *)in_RDI);
  QList<QString>::constFirst(in_stack_ffffffffffffff90);
  values(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QList<QString>::~QList((QList<QString> *)0x6f2e28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineParser::values(const QCommandLineOption &option) const
{
    return values(option.names().constFirst());
}